

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O0

void __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::SequenceLexicon
          (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this,hash<int> *hasher,
          equal_to<int> *key_equal)

{
  value_type_conflict2 local_58;
  allocator<unsigned_int> local_51;
  IdKeyEqual local_50 [2];
  IdHasher local_30;
  equal_to<int> *local_20;
  equal_to<int> *key_equal_local;
  hash<int> *hasher_local;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  local_20 = key_equal;
  key_equal_local = (equal_to<int> *)hasher;
  hasher_local = (hash<int> *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->values_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->begins_);
  IdHasher::IdHasher(&local_30,(hash<int> *)key_equal_local,this);
  IdKeyEqual::IdKeyEqual(local_50,local_20,this);
  std::allocator<unsigned_int>::allocator(&local_51);
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::dense_hash_set(&this->id_set_,0,&local_30,local_50,&local_51);
  std::allocator<unsigned_int>::~allocator(&local_51);
  gtl::
  dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::set_empty_key(&this->id_set_,&kEmptyKey);
  local_58 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->begins_,&local_58);
  return;
}

Assistant:

SequenceLexicon<T, Hasher, KeyEqual>::SequenceLexicon(const Hasher& hasher,
                                                      const KeyEqual& key_equal)
    : id_set_(0, IdHasher(hasher, this),
              IdKeyEqual(key_equal, this)) {
  id_set_.set_empty_key(kEmptyKey);
  begins_.push_back(0);
}